

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.hh
# Opt level: O0

void Arguments::postprocess(void)

{
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9d0;
  
  ghost_speed = pacman_speed * ghost_speed;
  initial_chase_cycle_rounds = (int)((float)initial_chase_cycle_rounds / pacman_speed);
  initial_scatter_cycle_rounds = (int)((float)initial_scatter_cycle_rounds / pacman_speed);
  cycle_rounds_stdev = cycle_rounds_stdev / pacman_speed;
  n_rounds_ghost_revive = (int)((float)n_rounds_ghost_revive / pacman_speed);
  n_rounds_powerpill = (int)((float)n_rounds_powerpill / pacman_speed);
  n_rounds_between_ghosts_start = (int)((float)n_rounds_between_ghosts_start / pacman_speed);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&local_9d0,(ulong)random_seed);
  memcpy(&random_generator,&local_9d0,0x9c8);
  reward_step = (double)pacman_speed * reward_step;
  visualization_speed = (double)(ghost_speed * 180000.0) / visualization_speed;
  if (pacman_ai_agent == INPUT) {
    plays = 1;
  }
  test_sampling_interval = test_statistics_precision / test_sampling;
  return;
}

Assistant:

void Arguments::postprocess() {
    Arguments::ghost_speed *= Arguments::pacman_speed;

    Arguments::initial_chase_cycle_rounds /= Arguments::pacman_speed;
    Arguments::initial_scatter_cycle_rounds /= Arguments::pacman_speed;
    Arguments::cycle_rounds_stdev /= Arguments::pacman_speed;
    Arguments::n_rounds_ghost_revive /= Arguments::pacman_speed;
    Arguments::n_rounds_powerpill /= Arguments::pacman_speed;
    Arguments::n_rounds_between_ghosts_start /= Arguments::pacman_speed;

    Arguments::random_generator = mt19937_64(Arguments::random_seed);

    Arguments::reward_step *= Arguments::pacman_speed;

    Arguments::visualization_speed = 180000*Arguments::ghost_speed/Arguments::visualization_speed;

    if (Arguments::pacman_ai_agent == INPUT) Arguments::plays = 1;

    Arguments::test_sampling_interval = Arguments::test_statistics_precision/Arguments::test_sampling;
}